

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall icu_63::SpoofData::SpoofData(SpoofData *this,UDataMemory *udm,UErrorCode *status)

{
  SpoofDataHeader *pSVar1;
  
  this->fRawData = (SpoofDataHeader *)0x0;
  this->fDataOwned = '\0';
  this->fUDM = (UDataMemory *)0x0;
  this->fMemLimit = 0;
  LOCK();
  (this->fRefCount).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  this->fCFUStrings = (UChar *)0x0;
  this->fCFUKeys = (int32_t *)0x0;
  this->fCFUValues = (uint16_t *)0x0;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  this->fUDM = udm;
  pSVar1 = (SpoofDataHeader *)udata_getMemory_63(udm);
  this->fRawData = pSVar1;
  validateDataVersion(this,status);
  this->fCFUKeys = (int32_t *)0x0;
  this->fCFUValues = (uint16_t *)0x0;
  this->fCFUStrings = (UChar *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pSVar1 = this->fRawData;
    if ((long)pSVar1->fCFUKeys != 0) {
      this->fCFUKeys = (int32_t *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUKeys + -4);
    }
    if ((long)pSVar1->fCFUStringIndex != 0) {
      this->fCFUValues = (uint16_t *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUStringIndex + -4);
    }
    if ((long)pSVar1->fCFUStringTable != 0) {
      this->fCFUStrings = (UChar *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUStringTable + -4);
    }
  }
  return;
}

Assistant:

SpoofData::SpoofData(UDataMemory *udm, UErrorCode &status)
{
    reset();
    if (U_FAILURE(status)) {
        return;
    }
    fUDM = udm;
    // fRawData is non-const because it may be constructed by the data builder.
    fRawData = reinterpret_cast<SpoofDataHeader *>(
            const_cast<void *>(udata_getMemory(udm)));
    validateDataVersion(status);
    initPtrs(status);
}